

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyUint64Uint8(void)

{
  bool bVar1;
  TestCase<unsigned_long,_unsigned_char,_1> TVar2;
  uint64_t x;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  uint64_t ret;
  TestCase<unsigned_long,_unsigned_char,_1> test;
  TestVector<unsigned_long,_unsigned_char,_1> tests;
  allocator *in_stack_fffffffffffffed8;
  allocator *in_stack_fffffffffffffee0;
  TestVector<unsigned_long,_unsigned_char,_1> *in_stack_fffffffffffffee8;
  TestVector<unsigned_long,_unsigned_char,_1> *this;
  allocator *in_stack_fffffffffffffef0;
  unsigned_long local_100;
  undefined2 local_f8;
  allocator local_d9;
  string local_d8 [39];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_b1;
  unsigned_long local_b0;
  allocator local_a1;
  string local_a0 [6];
  undefined1 in_stack_ffffffffffffff66;
  uchar in_stack_ffffffffffffff67;
  unsigned_long in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  TestVector<unsigned_long,_unsigned_char,_1> local_80;
  allocator local_61;
  string local_60 [40];
  TestCase<unsigned_long,_unsigned_char,_1> local_38;
  unsigned_long local_28;
  undefined2 local_20;
  TestVector<unsigned_long,_unsigned_char,_1> local_18;
  
  TestVector<unsigned_long,_unsigned_char,_1>::TestVector(&local_18);
  TVar2 = TestVector<unsigned_long,_unsigned_char,_1>::GetNext(in_stack_fffffffffffffee8);
  local_38.x = TVar2.x;
  local_28 = local_38.x;
  local_38._8_2_ = TVar2._8_2_;
  local_20._0_1_ = local_38.y;
  local_20._1_1_ = local_38.fExpected;
  local_38 = TVar2;
  while( true ) {
    bVar1 = TestVector<unsigned_long,_unsigned_char,_1>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeDivide<unsigned_long,unsigned_char>
                      ((unsigned_long)in_stack_fffffffffffffee0,
                       (uchar)((ulong)in_stack_fffffffffffffed8 >> 0x38),(unsigned_long *)0x19a288);
    if (bVar1 != (bool)(local_20._1_1_ & 1)) {
      in_stack_fffffffffffffef0 = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case uint64_uint8: ",in_stack_fffffffffffffef0);
      err_msg<unsigned_long,unsigned_char>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                 (bool)in_stack_ffffffffffffff66);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    local_80.count._3_1_ = 1;
    this = &local_80;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)this,&local_28);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator/=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffee0,(uchar)((ulong)in_stack_fffffffffffffed8 >> 0x38));
    if ((local_80.count._3_1_ & 1) != (local_20._1_1_ & 1)) {
      in_stack_fffffffffffffee0 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Error in case uint64_uint8 throw: ",in_stack_fffffffffffffee0);
      err_msg<unsigned_long,unsigned_char>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                 (bool)in_stack_ffffffffffffff66);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    local_80.count._3_1_ = 1;
    local_b0 = local_28;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_b1,(uchar *)&local_20);
    operator/=((unsigned_long *)this,
               (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(uchar)((ulong)in_stack_fffffffffffffef0 >> 0x38));
    if ((local_80.count._3_1_ & 1) != (local_20._1_1_ & 1)) {
      in_stack_fffffffffffffed8 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d8,"Error in case uint64_uint8 throw: ",in_stack_fffffffffffffed8);
      err_msg<unsigned_long,unsigned_char>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                 (bool)in_stack_ffffffffffffff66);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    TVar2 = TestVector<unsigned_long,_unsigned_char,_1>::GetNext(this);
    local_100 = TVar2.x;
    local_f8 = TVar2._8_2_;
    local_28 = local_100;
    local_20 = local_f8;
  }
  return;
}

Assistant:

void DivVerifyUint64Uint8()
{
    TestVector< std::uint64_t, std::uint8_t, OpType::Div > tests;
    TestCase< std::uint64_t, std::uint8_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::uint64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
          err_msg( "Error in case uint64_uint8: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_uint8 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::uint64_t x(test.x);
         x /= SafeInt<std::uint8_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_uint8 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}